

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

short __thiscall
duckdb::Interpolator<false>::Operation<short,short,duckdb::MadAccessor<short,short,short>>
          (Interpolator<false> *this,short *v_t,Vector *result,
          MadAccessor<short,_short,_short> *accessor)

{
  idx_t iVar1;
  idx_t iVar2;
  idx_t iVar3;
  long lVar4;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<short,_short,_short>_>_> __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<short,_short,_short>_>_> __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<short,_short,_short>_>_> __comp_01;
  bool bVar5;
  short sVar6;
  ulong uVar7;
  OutOfRangeException *pOVar8;
  short sVar9;
  int iVar10;
  unkbyte10 Var11;
  short result_1;
  short local_4a;
  string local_48;
  
  bVar5 = this->desc;
  iVar1 = this->FRN;
  iVar2 = this->begin;
  iVar3 = this->end;
  local_48._M_dataplus._M_p = (pointer)accessor;
  local_48._M_string_length = (size_type)accessor;
  local_48.field_2._M_local_buf[0] = bVar5;
  if (this->CRN == iVar1) {
    if (iVar1 != iVar3 && iVar2 != iVar3) {
      uVar7 = (long)((iVar3 * 2 - iVar2) - iVar2) >> 1;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_48.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar5;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<short*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<short,short,short>>>>
                (v_t + iVar2,v_t + iVar1,v_t + iVar3,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
    }
    sVar9 = v_t[this->FRN] - *accessor->median;
    if (sVar9 == -0x8000) {
      pOVar8 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Overflow on abs(%d)","");
      OutOfRangeException::OutOfRangeException<short>(pOVar8,&local_48,-0x8000);
      __cxa_throw(pOVar8,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    sVar6 = -sVar9;
    if (0 < sVar9) {
      sVar6 = sVar9;
    }
    bVar5 = TryCast::Operation<short,short>(sVar6,&local_4a,false);
    if (!bVar5) {
      Var11 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,short>
                (&local_48,(duckdb *)(ulong)(uint)(int)sVar6,(short)((unkuint10)Var11 >> 0x40));
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var11,(string *)&local_48);
      __cxa_throw((InvalidInputException *)Var11,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
  }
  else {
    if (iVar1 != iVar3 && iVar2 != iVar3) {
      uVar7 = (long)((iVar3 * 2 - iVar2) - iVar2) >> 1;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_48.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar5;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      ::std::
      __introselect<short*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<short,short,short>>>>
                (v_t + iVar2,v_t + iVar1,v_t + iVar3,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
    }
    iVar1 = this->FRN;
    iVar2 = this->end;
    local_48._M_dataplus._M_p = (pointer)accessor;
    local_48._M_string_length = (size_type)accessor;
    local_48.field_2._M_local_buf[0] = bVar5;
    if (this->CRN != iVar2 && iVar1 != iVar2) {
      uVar7 = (long)((iVar2 * 2 - iVar1) - iVar1) >> 1;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_48.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar5;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      ::std::
      __introselect<short*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<short,short,short>>>>
                (v_t + iVar1,v_t + this->CRN,v_t + iVar2,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
    }
    sVar9 = v_t[this->FRN] - *accessor->median;
    if (sVar9 == -0x8000) {
      pOVar8 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Overflow on abs(%d)","");
      OutOfRangeException::OutOfRangeException<short>(pOVar8,&local_48,-0x8000);
      __cxa_throw(pOVar8,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    sVar6 = -sVar9;
    if (0 < sVar9) {
      sVar6 = sVar9;
    }
    bVar5 = TryCast::Operation<short,short>(sVar6,&local_4a,false);
    if (!bVar5) {
      Var11 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,short>
                (&local_48,(duckdb *)(ulong)(uint)(int)sVar6,(short)((unkuint10)Var11 >> 0x40));
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var11,(string *)&local_48);
      __cxa_throw((InvalidInputException *)Var11,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    sVar9 = v_t[this->CRN] - *accessor->median;
    if (sVar9 == -0x8000) {
      pOVar8 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Overflow on abs(%d)","");
      OutOfRangeException::OutOfRangeException<short>(pOVar8,&local_48,-0x8000);
      __cxa_throw(pOVar8,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar10 = (int)local_4a;
    sVar6 = -sVar9;
    if (0 < sVar9) {
      sVar6 = sVar9;
    }
    bVar5 = TryCast::Operation<short,short>(sVar6,&local_4a,false);
    if (!bVar5) {
      Var11 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,short>
                (&local_48,(duckdb *)(ulong)(uint)(int)sVar6,(short)((unkuint10)Var11 >> 0x40));
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var11,(string *)&local_48);
      __cxa_throw((InvalidInputException *)Var11,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    local_4a = (short)(int)((double)(local_4a - iVar10) *
                            (this->RN -
                            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                             1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                           (double)iVar10);
  }
  return local_4a;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}